

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memfile.c
# Opt level: O1

void mwrite(memfile *mf,void *buf,uint num)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  uint uVar4;
  
  uVar2 = mf->pos + num;
  uVar1 = mf->len;
  uVar4 = uVar1;
  if (uVar1 < uVar2) {
    uVar4 = uVar1 + 0x1000;
    if (uVar1 + 0x1000 < uVar2) {
      uVar4 = uVar2;
    }
    uVar4 = uVar1 + (~uVar1 + uVar4 & 0xfffff000) + 0x1000;
    mf->len = uVar4;
  }
  if (uVar1 < uVar2) {
    pcVar3 = (char *)realloc(mf->buf,(long)(int)uVar4);
    mf->buf = pcVar3;
  }
  memcpy(mf->buf + mf->pos,buf,(ulong)num);
  if (mf->relativeto == (memfile *)0x0) {
    mf->pos = mf->pos + num;
  }
  else {
    for (; num != 0; num = num - 1) {
      if ((mf->relativepos < mf->relativeto->pos) &&
         (mf->buf[mf->pos] == mf->relativeto->buf[mf->relativepos])) {
        if ((mf->curcmd != MDIFF_COPY) || (0x3ffe < mf->curcount)) {
          mdiffflush(mf);
          mf->curcount = 0;
        }
        mf->curcmd = MDIFF_COPY;
      }
      else {
        if ((mf->curcmd != MDIFF_EDIT) || (0x3ffe < mf->curcount)) {
          mdiffflush(mf);
          mf->curcount = 0;
        }
        mf->curcmd = MDIFF_EDIT;
      }
      mf->curcount = mf->curcount + 1;
      mf->pos = mf->pos + 1;
      mf->relativepos = mf->relativepos + 1;
    }
  }
  return;
}

Assistant:

void mwrite(struct memfile *mf, const void *buf, unsigned int num)
{
	boolean do_realloc = FALSE;
	while (mf->len < mf->pos + num) {
	    mf->len += 4096;
	    do_realloc = TRUE;
	}

	if (do_realloc)
	    mf->buf = realloc(mf->buf, mf->len);
	memcpy(&mf->buf[mf->pos], buf, num);

	if (!mf->relativeto) {
	    mf->pos += num;
	} else {
	    /* calculate and record the diff as well */
	    while (num--) {
		if (mf->relativepos < mf->relativeto->pos &&
		    mf->buf[mf->pos] == mf->relativeto->buf[mf->relativepos]) {
		    if (mf->curcmd != MDIFF_COPY || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_COPY;
		    mf->curcount++;
		} else {
		    /*
		     * Note that mdiffflush is responsible for writing the
		     * actual data that was edited, once we have a complete
		     * run of it. So there's no need to record the data
		     * anywhere but in buf.
		     */
		    if (mf->curcmd != MDIFF_EDIT || mf->curcount >= 0x3fff) {
			mdiffflush(mf);
			mf->curcount = 0;
		    }
		    mf->curcmd = MDIFF_EDIT;
		    mf->curcount++;
		}
		mf->pos++;
		mf->relativepos++;
	    }
	}
}